

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

int __thiscall
GEO::geofile::adjust_points
          (geofile *this,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes)

{
  int iVar1;
  bool bVar2;
  key_type *pkVar3;
  pointer ppVar4;
  pointer ppVar5;
  reference piVar6;
  pointer ppVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d0;
  iterator vector_it;
  iterator vector_it_end;
  iterator i_2;
  iterator phys_p_it;
  iterator phys_p_end;
  _Self local_98;
  iterator i_1;
  iterator l_it;
  iterator l_m_end;
  insert_return_type local_68;
  undefined1 local_40 [8];
  node_type nodeHandler;
  iterator i;
  iterator change_end;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *changes_local;
  geofile *this_local;
  
  i = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end(changes);
  nodeHandler._M_pmapped =
       (__pointer<typename_pair<const_int,_point>::second_type>)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                 (changes);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&nodeHandler._M_pmapped,&i);
    if (!bVar2) break;
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped);
    std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
    extract((node_type *)local_40,&this->points_map,&ppVar7->first);
    bVar2 = std::
            _Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
            ::empty((_Node_handle_common<std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
                     *)local_40);
    if (!bVar2) {
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped);
      iVar1 = ppVar7->second;
      pkVar3 = std::
               _Node_handle<int,_std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
               ::key((_Node_handle<int,_std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
                      *)local_40);
      *pkVar3 = iVar1;
      std::map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
      ::insert(&local_68,&this->points_map,
               (_Node_handle<int,_std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
                *)local_40);
      std::
      _Node_insert_return<std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>,_std::_Node_handle<int,_std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>_>
      ::~_Node_insert_return(&local_68);
    }
    std::
    _Node_handle<int,_std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
    ::~_Node_handle((_Node_handle<int,_std::pair<const_int,_GEO::point>,_std::allocator<std::_Rb_tree_node<std::pair<const_int,_GEO::point>_>_>_>
                     *)local_40);
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&nodeHandler._M_pmapped,0);
  }
  l_it = std::map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
         ::end(&this->lines_map);
  i_1._M_node = (_Base_ptr)
                std::
                map<int,_GEO::line,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::line>_>_>
                ::begin(&this->lines_map);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&i_1,&l_it);
    if (!bVar2) break;
    local_98._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                   (changes);
    while( true ) {
      bVar2 = std::operator!=(&local_98,&i);
      if (!bVar2) break;
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_GEO::line>_> *)&i_1);
      iVar1 = (ppVar4->second).start;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_98);
      if (iVar1 == ppVar7->first) {
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_98);
        iVar1 = ppVar7->second;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_GEO::line>_> *)&i_1);
        (ppVar4->second).start = iVar1;
      }
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_GEO::line>_> *)&i_1);
      iVar1 = (ppVar4->second).end;
      ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_98);
      if (iVar1 == ppVar7->first) {
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_98);
        iVar1 = ppVar7->second;
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_GEO::line>_> *)&i_1);
        (ppVar4->second).end = iVar1;
      }
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++(&local_98,0);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_GEO::line>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_GEO::line>_> *)&i_1,0);
  }
  phys_p_it = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::end(&this->physical_points_map);
  i_2._M_node = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::begin(&this->physical_points_map);
  while( true ) {
    bVar2 = std::operator!=((_Self *)&i_2,&phys_p_it);
    if (!bVar2) break;
    vector_it_end._M_current =
         (int *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                begin(changes);
    while( true ) {
      bVar2 = std::operator!=((_Self *)&vector_it_end,&i);
      if (!bVar2) break;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                             *)&i_2);
      vector_it = std::vector<int,_std::allocator<int>_>::end(&ppVar5->second);
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                             *)&i_2);
      local_d0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&ppVar5->second);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&local_d0,&vector_it);
        if (!bVar2) break;
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_d0);
        iVar1 = *piVar6;
        ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vector_it_end);
        if (iVar1 == ppVar7->first) {
          ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                             ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vector_it_end);
          iVar1 = ppVar7->second;
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_d0);
          *piVar6 = iVar1;
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_d0,0);
      }
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)&vector_it_end,0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                  *)&i_2,0);
  }
  return 0;
}

Assistant:

int GEO::geofile::adjust_points(std::map<int,int> changes)
{
    auto change_end = changes.end();
    for (auto i = changes.begin(); i != change_end; i++)
    {
        auto nodeHandler = points_map.extract(i->first);
        if(!nodeHandler.empty())
            {
                nodeHandler.key() = i->second;
                points_map.insert(std::move(nodeHandler));
            }
    }
    // Adjust dependencies to mirror the changes.
    //Lines
    auto l_m_end  = lines_map.end();
    for (auto l_it = lines_map.begin(); l_it != l_m_end; l_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            if (l_it->second.start == i->first)
                l_it->second.start = i->second;
            if (l_it->second.end == i->first)
                l_it->second.end = i->second;
        }
    }
    //Physical points
    auto phys_p_end = physical_points_map.end();
    for (auto phys_p_it = physical_points_map.begin(); phys_p_it != phys_p_end; phys_p_it++)
    {
        for (auto i = changes.begin(); i != change_end; i++)
        {
            auto vector_it_end = phys_p_it->second.end();
            for (auto vector_it = phys_p_it->second.begin(); vector_it != vector_it_end; vector_it++)
            {
                if(*vector_it==i->first)
                    *vector_it=i->second;
            }
        }
    }
    return EXIT_SUCCESS;
}